

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  undefined8 uVar1;
  uint uVar2;
  IContext *pIVar3;
  IConfig *pIVar4;
  ulong uVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string subs;
  size_t i;
  Ptr<const_Catch::IConfig> local_40;
  undefined1 local_38 [8];
  string s;
  string *value_local;
  
  s.field_2._8_8_ = value;
  std::__cxx11::string::string((string *)local_38,(string *)value);
  pIVar3 = getCurrentContext();
  (*pIVar3->_vptr_IContext[6])(&local_40);
  pIVar4 = Ptr<const_Catch::IConfig>::operator->(&local_40);
  uVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])();
  Ptr<const_Catch::IConfig>::~Ptr(&local_40);
  if ((uVar2 & 1) != 0) {
    for (subs.field_2._8_8_ = 0; uVar1 = subs.field_2._8_8_, uVar5 = std::__cxx11::string::size(),
        (ulong)uVar1 < uVar5; subs.field_2._8_8_ = subs.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)local_78);
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar6 == '\t') {
        std::__cxx11::string::operator=((string *)local_78,"\\t");
      }
      else if (*pcVar6 == '\n') {
        std::__cxx11::string::operator=((string *)local_78,"\\n");
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_38);
        std::operator+(&local_b8,&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_38);
        std::operator+(&local_98,&local_b8,&local_f8);
        std::__cxx11::string::operator=((string *)local_38,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        subs.field_2._8_8_ = subs.field_2._8_8_ + 1;
      }
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  std::operator+(&local_118,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(__return_storage_ptr__,&local_118,"\"");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}